

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O2

int redisAsyncCommand(redisAsyncContext *ac,redisCallbackFn *fn,void *privdata,char *format,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_108;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c8 = in_R8;
  local_c0 = in_R9;
  pthread_mutex_lock((pthread_mutex_t *)&ac->ctxlock);
  local_108.overflow_arg_area = &ap[0].overflow_arg_area;
  local_108.gp_offset = 0x20;
  local_108.fp_offset = 0x30;
  local_108.reg_save_area = local_e8;
  iVar1 = redisvAsyncCommand(ac,fn,privdata,format,&local_108);
  pthread_mutex_unlock((pthread_mutex_t *)&ac->ctxlock);
  return iVar1;
}

Assistant:

int redisAsyncCommand(redisAsyncContext *ac, redisCallbackFn *fn, void *privdata, const char *format, ...) {
    pthread_mutex_lock(&ac->ctxlock);
    va_list ap;
    int status;
    va_start(ap,format);
    status = redisvAsyncCommand(ac,fn,privdata,format,ap);
    va_end(ap);
    pthread_mutex_unlock(&ac->ctxlock);
    return status;
}